

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_utf8_exception.cpp
# Opt level: O2

void __thiscall
argo::json_utf8_exception::json_utf8_exception
          (json_utf8_exception *this,exception_type et,string *s)

{
  char *pcVar1;
  
  json_exception::json_exception(&this->super_json_exception,et);
  *(undefined ***)&this->super_json_exception = &PTR__exception_00126bf8;
  this->m_byte_index = 0;
  pcVar1 = get_main_message(this);
  snprintf((this->super_json_exception).m_message,200,"%s : %s",pcVar1,(s->_M_dataplus)._M_p);
  return;
}

Assistant:

json_utf8_exception::json_utf8_exception(exception_type et, const string &s) noexcept :
                    json_exception(et), m_byte_index(0)
{
    snprintf(m_message, max_message_length, "%s : %s", get_main_message(), s.c_str());
}